

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclass.h
# Opt level: O1

bool __thiscall SQInstance::Get(SQInstance *this,SQObjectPtr *key,SQObjectPtr *val)

{
  SQUnsignedInteger *pSVar1;
  SQObjectType SVar2;
  SQClassMember *pSVar3;
  bool bVar4;
  uint uVar5;
  SQObjectType SVar6;
  ulong uVar7;
  long *plVar8;
  SQTable *pSVar9;
  
  bVar4 = SQTable::Get(this->_class->_members,key,val);
  if (bVar4) {
    uVar5 = SUB84((val->super_SQObject)._unVal,0);
    if ((uVar5 >> 0x19 & 1) == 0) {
      pSVar3 = (this->_class->_methods)._vals;
      uVar7 = (ulong)((uVar5 & 0xffffff) << 5);
      SVar2 = (val->super_SQObject)._type;
      pSVar9 = (val->super_SQObject)._unVal.pTable;
      (val->super_SQObject)._unVal =
           *(SQObjectValue *)((long)&(pSVar3->val).super_SQObject._unVal + uVar7);
      SVar6 = *(SQObjectType *)((long)&(pSVar3->val).super_SQObject._type + uVar7);
    }
    else {
      uVar5 = (uVar5 & 0xffffff) << 4;
      plVar8 = (long *)((long)&this->_values[0].super_SQObject._unVal + (ulong)uVar5);
      SVar6 = *(SQObjectType *)((long)&this->_values[0].super_SQObject._type + (ulong)uVar5);
      if (SVar6 == OT_WEAKREF) {
        SVar6 = *(SQObjectType *)(*plVar8 + 0x18);
        plVar8 = (long *)(*plVar8 + 0x20);
      }
      SVar2 = (val->super_SQObject)._type;
      pSVar9 = (val->super_SQObject)._unVal.pTable;
      (val->super_SQObject)._unVal.pWeakRef = (SQWeakRef *)*plVar8;
    }
    (val->super_SQObject)._type = SVar6;
    if ((SVar6 >> 0x1b & 1) != 0) {
      pSVar1 = &(((val->super_SQObject)._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 + 1;
    }
    if ((SVar2 >> 0x1b & 1) != 0) {
      pSVar1 = &(pSVar9->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 - 1;
      if (*pSVar1 == 0) {
        (*(pSVar9->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])
                  ();
      }
    }
  }
  return bVar4;
}

Assistant:

bool Get(const SQObjectPtr &key,SQObjectPtr &val)  {
        if(_class->_members->Get(key,val)) {
            if(_isfield(val)) {
                SQObjectPtr &o = _values[_member_idx(val)];
                val = _realval(o);
            }
            else {
                val = _class->_methods[_member_idx(val)].val;
            }
            return true;
        }
        return false;
    }